

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O0

void __thiscall
Wave::Wave(Wave *this,uint height,uint width,
          vector<double,_std::allocator<double>_> *patterns_frequencies)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  ulong __n;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  double entropy_base;
  double log_base_s;
  uint i;
  double base_s;
  double base_entropy;
  EntropyMemoisation *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffeb8;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> *this_00;
  size_t in_stack_fffffffffffffec8;
  Array2D<unsigned_char> *in_stack_fffffffffffffed0;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  allocator_type local_d9 [28];
  vector<double,_std::allocator<double>_> local_bd;
  vector<double,_std::allocator<double>_> local_98 [3];
  double local_40;
  double local_38;
  uint local_2c;
  double local_28;
  double local_20;
  vector<double,_std::allocator<double>_> *local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  anon_unknown.dwarf_4eeb::get_plogp(in_stack_fffffffffffffed8);
  dVar3 = anon_unknown.dwarf_4eeb::get_min_abs_half
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
  *(double *)(in_RDI + 0x30) = dVar3;
  EntropyMemoisation::EntropyMemoisation(in_stack_fffffffffffffeb0);
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
  *(size_type *)(in_RDI + 0xb8) = sVar1;
  Array2D<unsigned_char>::Array2D
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
             (uchar)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
  *(int *)(in_RDI + 0xe8) = local_10;
  *(int *)(in_RDI + 0xec) = local_c;
  *(int *)(in_RDI + 0xf0) = local_c * local_10;
  local_20 = 0.0;
  local_28 = 0.0;
  for (local_2c = 0; (ulong)local_2c < *(ulong *)(in_RDI + 0xb8); local_2c = local_2c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(ulong)local_2c);
    local_20 = *pvVar2 + local_20;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(ulong)local_2c);
    local_28 = *pvVar2 + local_28;
  }
  local_38 = log(local_28);
  local_40 = local_38 - local_20 / local_28;
  std::allocator<double>::allocator((allocator<double> *)0x10ef44);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(value_type *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffec0,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffec0);
  std::allocator<double>::~allocator((allocator<double> *)0x10ef97);
  std::allocator<double>::allocator((allocator<double> *)0x10efbf);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(value_type *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffec0,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffec0);
  std::allocator<double>::~allocator((allocator<double> *)0x10f012);
  std::allocator<double>::allocator((allocator<double> *)0x10f03a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(value_type *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  this_00 = local_98;
  std::vector<double,_std::allocator<double>_>::operator=
            (this_00,(vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x10f08d);
  __n = (ulong)(uint)(local_10 * local_c);
  local_bd.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._1_4_ = *(undefined4 *)(in_RDI + 0xb8);
  this_01 = &local_bd;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10f0c7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,__n,
             (value_type_conflict2 *)this_00,(allocator_type *)in_stack_fffffffffffffeb8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10f118);
  __a = local_d9;
  std::allocator<double>::allocator((allocator<double> *)0x10f13d);
  std::vector<double,_std::allocator<double>_>::vector(this_01,__n,(value_type *)this_00,__a);
  std::vector<double,_std::allocator<double>_>::operator=
            (this_00,(vector<double,_std::allocator<double>_> *)__a);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x10f18f);
  return;
}

Assistant:

Wave::Wave(unsigned height, unsigned width,
     const std::vector<double> &patterns_frequencies) noexcept
  : patterns_frequencies(patterns_frequencies),
    plogp_patterns_frequencies(get_plogp(patterns_frequencies)),
    min_abs_half_plogp(get_min_abs_half(plogp_patterns_frequencies)),
    is_impossible(false), nb_patterns(patterns_frequencies.size()),
    data(width * height, nb_patterns, 1), width(width), height(height),
    size(height * width) {
  // Initialize the memoisation of entropy.
  double base_entropy = 0;
  double base_s = 0;
  for (unsigned i = 0; i < nb_patterns; i++) {
    base_entropy += plogp_patterns_frequencies[i];
    base_s += patterns_frequencies[i];
  }
  double log_base_s = log(base_s);
  double entropy_base = log_base_s - base_entropy / base_s;
  memoisation.plogp_sum = std::vector<double>(width * height, base_entropy);
  memoisation.sum = std::vector<double>(width * height, base_s);
  memoisation.log_sum = std::vector<double>(width * height, log_base_s);
  memoisation.nb_patterns =
    std::vector<unsigned>(width * height, static_cast<unsigned>(nb_patterns));
  memoisation.entropy = std::vector<double>(width * height, entropy_base);
}